

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_cdef(lua_State *L)

{
  int errcode;
  GCstr *pGVar1;
  ulong uVar2;
  CPState cp;
  
  pGVar1 = lj_lib_checkstr(L,1);
  cp.cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  (cp.cts)->L = L;
  cp.p = (char *)(pGVar1 + 1);
  cp.param = L->base + 1;
  cp.mode = 5;
  cp.L = L;
  cp.srcname = cp.p;
  errcode = lj_cparse(&cp);
  if (errcode == 0) {
    uVar2 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar2 + 0x24) <= *(uint *)(uVar2 + 0x20)) {
      lj_gc_step(L);
    }
    return 0;
  }
  lj_err_throw(L,errcode);
}

Assistant:

LJLIB_CF(ffi_cdef)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  CPState cp;
  int errcode;
  cp.L = L;
  cp.cts = ctype_cts(L);
  cp.srcname = strdata(s);
  cp.p = strdata(s);
  cp.param = L->base+1;
  cp.mode = CPARSE_MODE_MULTI|CPARSE_MODE_DIRECT;
  errcode = lj_cparse(&cp);
  if (errcode) lj_err_throw(L, errcode);  /* Propagate errors. */
  lj_gc_check(L);
  return 0;
}